

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_font_atlas_begin(nk_font_atlas *atlas)

{
  nk_plugin_free p_Var1;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x344e,"void nk_font_atlas_begin(struct nk_font_atlas *)");
  }
  if (((atlas->temporary).alloc != (nk_plugin_alloc)0x0) &&
     ((atlas->temporary).free != (nk_plugin_free)0x0)) {
    if (((atlas->permanent).alloc != (nk_plugin_alloc)0x0) &&
       (p_Var1 = (atlas->permanent).free, p_Var1 != (nk_plugin_free)0x0)) {
      if (atlas->glyphs != (nk_font_glyph *)0x0) {
        (*p_Var1)((atlas->permanent).userdata,atlas->glyphs);
        atlas->glyphs = (nk_font_glyph *)0x0;
      }
      if (atlas->pixel != (void *)0x0) {
        (*(atlas->permanent).free)((atlas->permanent).userdata,atlas->pixel);
        atlas->pixel = (void *)0x0;
      }
      return;
    }
    __assert_fail("atlas->permanent.alloc && atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3450,"void nk_font_atlas_begin(struct nk_font_atlas *)");
  }
  __assert_fail("atlas->temporary.alloc && atlas->temporary.free",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x344f,"void nk_font_atlas_begin(struct nk_font_atlas *)");
}

Assistant:

NK_API void
nk_font_atlas_begin(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc && atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc && atlas->permanent.free);
    if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free ||
        !atlas->temporary.alloc || !atlas->temporary.free) return;
    if (atlas->glyphs) {
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
        atlas->glyphs = 0;
    }
    if (atlas->pixel) {
        atlas->permanent.free(atlas->permanent.userdata, atlas->pixel);
        atlas->pixel = 0;
    }
}